

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask22_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  
  uVar1 = in[1];
  uVar2 = in[3];
  uVar3 = in[5];
  *out = uVar1 << 0x16 | *in;
  uVar4 = in[2];
  out[1] = uVar4 << 0xc | uVar1 >> 10;
  uVar1 = in[4];
  uVar5 = in[6];
  out[2] = uVar1 << 0x18 | uVar2 << 2 | uVar4 >> 0x14;
  uVar4 = in[7];
  out[3] = uVar3 << 0xe | uVar1 >> 8;
  out[4] = uVar4 << 0x1a | uVar5 << 4 | uVar3 >> 0x12;
  out[5] = uVar4 >> 6;
  return out + 6;
}

Assistant:

uint32_t *__fastpackwithoutmask22_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (22 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (22 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (22 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (22 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (22 - 16);
  ++in;

  return out + 1;
}